

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indirect_value.h
# Opt level: O0

indirect_value<int,_stats,_stats> * __thiscall
isocpp_p1950::indirect_value<int,_stats,_stats>::operator=
          (indirect_value<int,_stats,_stats> *this,indirect_value<int,_stats,_stats> *i)

{
  pointer piVar1;
  undefined1 local_28 [8];
  unique_ptr<int,_std::reference_wrapper<const_stats>_> temp_guard;
  indirect_value<int,_stats,_stats> *i_local;
  indirect_value<int,_stats,_stats> *this_local;
  
  temp_guard._M_t.super___uniq_ptr_impl<int,_std::reference_wrapper<const_stats>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::reference_wrapper<const_stats>_>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl = (int *)i;
  make_guarded_copy((indirect_value<int,_stats,_stats> *)local_28);
  reset(this);
  indirect_value_copy_base<stats,_true>::operator=
            ((indirect_value_copy_base<stats,_true> *)this,
             (indirect_value_copy_base<stats,_true> *)
             temp_guard._M_t.super___uniq_ptr_impl<int,_std::reference_wrapper<const_stats>_>._M_t.
             super__Tuple_impl<0UL,_int_*,_std::reference_wrapper<const_stats>_>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl);
  indirect_value_delete_base<stats,_true>::operator=
            ((indirect_value_delete_base<stats,_true> *)((long)&this->ptr_ + 1),
             (indirect_value_delete_base<stats,_true> *)
             ((long)temp_guard._M_t.super___uniq_ptr_impl<int,_std::reference_wrapper<const_stats>_>
                    ._M_t.super__Tuple_impl<0UL,_int_*,_std::reference_wrapper<const_stats>_>.
                    super__Head_base<0UL,_int_*,_false>._M_head_impl + 1));
  piVar1 = std::unique_ptr<int,_std::reference_wrapper<const_stats>_>::release
                     ((unique_ptr<int,_std::reference_wrapper<const_stats>_> *)local_28);
  this->ptr_ = piVar1;
  std::unique_ptr<int,_std::reference_wrapper<const_stats>_>::~unique_ptr
            ((unique_ptr<int,_std::reference_wrapper<const_stats>_> *)local_28);
  return this;
}

Assistant:

constexpr indirect_value& operator=(const indirect_value& i) {
    // When copying T throws, *this will remain unchanged.
    // When assigning copy_base or delete_base throws,
    // ptr_ will be null.
    auto temp_guard = i.make_guarded_copy();
    reset();
    copy_base::operator=(i);
    delete_base::operator=(i);
    ptr_ = temp_guard.release();
    return *this;
  }